

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.h
# Opt level: O2

void __thiscall axl::io::ShmtBase::~ShmtBase(ShmtBase *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  sl::Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>::~Handle
            ((Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_> *)
             &this->m_writeSemaphore);
  sl::Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>::~Handle
            ((Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_> *)
             &this->m_readSemaphore);
  Mapping::~Mapping(&this->m_mapping);
  sl::Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_>::~Handle
            ((Handle<int,_axl::io::psx::CloseFile,_axl::sl::MinusOne<int>_> *)&this->m_file);
  return;
}

Assistant:

~ShmtBase() {
		close();
	}